

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::TryGetValue<Js::EvalMapStringInternal<false>>
          (BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,EvalMapStringInternal<false> *key,ScriptFunction **value)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  hash_t hVar4;
  long lVar5;
  uint depth;
  
  lVar2 = *(long *)this;
  depth = 0;
  if (lVar2 != 0) {
    hVar4 = PrimePolicy::ModPrime(key->hash >> 1,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar1 = *(uint *)(lVar2 + (ulong)hVar4 * 4);
    depth = 0;
    if (-1 < (int)uVar1) {
      lVar2 = *(long *)(this + 8);
      depth = 0;
      do {
        lVar5 = (ulong)uVar1 * 0x38;
        bVar3 = Js::EvalMapStringInternal<false>::operator==
                          ((EvalMapStringInternal<false> *)(lVar5 + lVar2 + 0x10),key);
        if (bVar3) {
          if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
          }
          *value = *(ScriptFunction **)(*(long *)(this + 8) + lVar5);
          return true;
        }
        depth = depth + 1;
        uVar1 = *(uint *)(lVar5 + lVar2 + 8);
      } while (-1 < (int)uVar1);
    }
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
  }
  return false;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }